

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

ON_LineCurve * __thiscall ON_LineCurve::operator=(ON_LineCurve *this,ON_Line *L)

{
  double dVar1;
  ON_Line *L_local;
  ON_LineCurve *this_local;
  
  memcpy(&this->m_line,L,0x30);
  (this->m_t).m_t[0] = 0.0;
  dVar1 = ON_Line::Length(L);
  (this->m_t).m_t[1] = dVar1;
  dVar1 = (this->m_t).m_t[1];
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    (this->m_t).m_t[1] = 1.0;
  }
  this->m_dim = 3;
  return this;
}

Assistant:

ON_LineCurve& ON_LineCurve::operator=( const ON_Line& L )
{
  m_line = L;
  m_t.m_t[0] = 0.0;
  m_t.m_t[1] = L.Length();
  if ( m_t.m_t[1] == 0.0 )
    m_t.m_t[1] = 1.0;
  m_dim = 3;
  return *this;
}